

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::generateLmfaoQuery(SqlGenerator *this)

{
  undefined8 uVar1;
  bool bVar2;
  __buckets_ptr pp_Var3;
  size_type sVar4;
  reference ppAVar5;
  reference pvVar6;
  ulong uVar7;
  reference rVar8;
  reference rVar9;
  ofstream ofs;
  size_t id;
  pair<unsigned_long,_unsigned_long> viewAggID;
  size_t n;
  string viewAgg;
  size_t f;
  prod_bitset *product;
  string localAgg;
  size_t i_1;
  size_t incomingCounter;
  string agg;
  Aggregate *aggregate;
  size_t aggNo;
  string aggregateString;
  size_t i;
  string fvars;
  vector<bool,_std::allocator<bool>_> viewBitset;
  size_t numberIncomingViews;
  TDNode *node;
  View *v;
  size_t viewID;
  string returnString;
  size_t in_stack_fffffffffffff788;
  TreeDecomposition *in_stack_fffffffffffff790;
  _Bit_type in_stack_fffffffffffff798;
  _Bit_type *in_stack_fffffffffffff7a0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff7a8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff7b0;
  TDNode *in_stack_fffffffffffff7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c0;
  _Bit_type in_stack_fffffffffffff7c8;
  _Bit_type *in_stack_fffffffffffff7d0;
  allocator *in_stack_fffffffffffff7d8;
  pointer local_7c8;
  string local_790 [32];
  ostream local_770 [512];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [16];
  size_t in_stack_fffffffffffffb00;
  SqlGenerator *in_stack_fffffffffffffb08;
  reference local_4f0;
  vector<bool,_std::allocator<bool>_> *local_4e0;
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  reference local_2d8;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  unsigned_long local_208;
  unsigned_long uStack_200;
  pointer local_1f8;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  ulong local_188;
  reference local_180;
  allocator local_171;
  string local_170 [32];
  ulong local_150;
  size_type local_148;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  value_type local_118;
  ulong local_110;
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  ulong local_c0;
  allocator local_b1;
  undefined1 local_b0 [136];
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",(allocator *)(local_b0 + 0x87));
  std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 0x87));
  rVar8._M_mask = in_stack_fffffffffffff7c8;
  rVar8._M_p = in_stack_fffffffffffff7d0;
  rVar9._M_mask = in_stack_fffffffffffff798;
  rVar9._M_p = in_stack_fffffffffffff7a0;
  local_b0._104_8_ = (__buckets_ptr)0x0;
  while( true ) {
    uVar1 = local_b0._104_8_;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x31031c);
    pp_Var3 = (__buckets_ptr)QueryCompiler::numberOfViews((QueryCompiler *)0x310324);
    if (pp_Var3 <= (ulong)uVar1) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x310358);
    local_b0._96_8_ =
         QueryCompiler::getView
                   ((QueryCompiler *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x310393);
    local_b0._88_8_ =
         TreeDecomposition::getRelation(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    if (*(uint *)(local_b0._96_8_ + 4) == *(uint *)(local_b0._96_8_ + 8)) {
      local_7c8 = (pointer)((TDNode *)local_b0._88_8_)->_numOfNeighbors;
    }
    else {
      local_7c8 = (pointer)(((TDNode *)local_b0._88_8_)->_numOfNeighbors - 1);
    }
    local_b0._80_8_ = local_7c8;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x310429);
    QueryCompiler::numberOfViews((QueryCompiler *)0x310431);
    std::allocator<bool>::allocator((allocator<bool> *)0x310450);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)rVar9._M_p,rVar9._M_mask,
               (allocator_type *)in_stack_fffffffffffff790);
    std::allocator<bool>::~allocator((allocator<bool> *)0x31047c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b0,"",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    for (local_c0 = 0; local_c0 < 100; local_c0 = local_c0 + 1) {
      bVar2 = std::bitset<100UL>::test
                        ((bitset<100UL> *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      if (bVar2) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x31051a);
        TreeDecomposition::getAttribute((TreeDecomposition *)rVar9._M_p,rVar9._M_mask);
        std::operator+(&in_stack_fffffffffffff7b8->_name,(char *)in_stack_fffffffffffff7b0);
        std::__cxx11::string::operator+=((string *)local_b0,local_e0);
        std::__cxx11::string::~string(local_e0);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"",&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    local_110 = 0;
    while( true ) {
      uVar7 = local_110;
      sVar4 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                        ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                         (local_b0._96_8_ + 0x20));
      if (sVar4 <= uVar7) break;
      ppAVar5 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                           (local_b0._96_8_ + 0x20),local_110);
      local_118 = *ppAVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"",&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      local_148 = 0;
      local_150 = 0;
      while( true ) {
        uVar7 = local_150;
        sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                          (&local_118->_agg);
        if (sVar4 <= uVar7) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"",&local_171);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        local_180 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](&local_118->_agg,local_150);
        for (local_188 = 0; local_188 < 0x5dc; local_188 = local_188 + 1) {
          bVar2 = std::bitset<1500UL>::test
                            ((bitset<1500UL> *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
          if (bVar2) {
            getFunctionString_abi_cxx11_(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           rVar9._M_mask,(char *)in_stack_fffffffffffff790);
            std::__cxx11::string::operator+=(local_170,local_1a8);
            std::__cxx11::string::~string(local_1a8);
            std::__cxx11::string::~string(local_1c8);
          }
        }
        std::__cxx11::string::operator+=((string *)&local_138,local_170);
        in_stack_fffffffffffff7d8 = &local_1e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e8,"",in_stack_fffffffffffff7d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        for (local_1f8 = (pointer)0x0; local_1f8 < (ulong)local_b0._80_8_;
            local_1f8 = (pointer)((long)local_1f8 + 1)) {
          pvVar6 = std::
                   vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::operator[](&local_118->_incoming,local_148);
          local_208 = pvVar6->first;
          uStack_200 = pvVar6->second;
          std::__cxx11::to_string(rVar8._M_mask);
          std::operator+((char *)rVar9._M_mask,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff790);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         rVar9._M_mask,(char *)in_stack_fffffffffffff790);
          std::__cxx11::to_string(rVar8._M_mask);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         rVar8._M_mask,in_stack_fffffffffffff7c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         rVar9._M_mask,(char *)in_stack_fffffffffffff790);
          std::__cxx11::string::operator+=(local_1e8,local_228);
          std::__cxx11::string::~string(local_228);
          std::__cxx11::string::~string(local_248);
          std::__cxx11::string::~string(local_2c8);
          std::__cxx11::string::~string(local_268);
          std::__cxx11::string::~string(local_288);
          std::__cxx11::string::~string(local_2a8);
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8);
          local_2d8 = rVar8;
          std::_Bit_reference::operator=(&local_2d8,true);
          local_148 = local_148 + 1;
        }
        std::__cxx11::string::operator+=((string *)&local_138,local_1e8);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          in_stack_fffffffffffff7c0 = &local_138;
          std::__cxx11::string::pop_back();
          std::__cxx11::string::operator+=((string *)in_stack_fffffffffffff7c0,"+");
        }
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_170);
        local_150 = local_150 + 1;
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::__cxx11::string::pop_back();
      }
      else {
        std::__cxx11::string::operator=((string *)&local_138,"1");
      }
      std::operator+((char *)in_stack_fffffffffffff7d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar8._M_p
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rVar9._M_mask,(char *)in_stack_fffffffffffff790);
      std::__cxx11::to_string(rVar8._M_mask);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rVar8._M_mask,in_stack_fffffffffffff7c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rVar9._M_mask,(char *)in_stack_fffffffffffff790);
      std::__cxx11::to_string(rVar8._M_mask);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rVar8._M_mask,in_stack_fffffffffffff7c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     rVar9._M_mask,(char *)in_stack_fffffffffffff790);
      std::__cxx11::string::operator+=(local_100,local_2f8);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_358);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string((string *)&local_138);
      local_110 = local_110 + 1;
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::to_string(rVar8._M_mask);
    std::operator+((char *)rVar9._M_mask,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff790);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,(char *)in_stack_fffffffffffff790);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff790);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff790);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,(char *)in_stack_fffffffffffff790);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x311132);
    in_stack_fffffffffffff7b8 =
         TreeDecomposition::getRelation(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff790);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar9._M_mask,(char *)in_stack_fffffffffffff790);
    std::__cxx11::string::operator+=(local_28,local_3f8);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string(local_438);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string(local_4d8);
    local_4e0 = (vector<bool,_std::allocator<bool>_> *)0x0;
    while( true ) {
      in_stack_fffffffffffff7a8 = local_4e0;
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x311231);
      in_stack_fffffffffffff7b0 =
           (vector<bool,_std::allocator<bool>_> *)
           QueryCompiler::numberOfViews((QueryCompiler *)0x311239);
      if (in_stack_fffffffffffff7b0 <= in_stack_fffffffffffff7a8) break;
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8);
      local_4f0 = rVar9;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_4f0);
      if (bVar2) {
        std::__cxx11::to_string(rVar8._M_mask);
        std::operator+((char *)rVar9._M_mask,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff790);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       rVar9._M_mask,(char *)in_stack_fffffffffffff790);
        std::__cxx11::string::operator+=(local_28,local_510);
        std::__cxx11::string::~string(local_510);
        std::__cxx11::string::~string(local_530);
        std::__cxx11::string::~string(local_550);
      }
      local_4e0 = (vector<bool,_std::allocator<bool>_> *)
                  ((long)&(local_4e0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      in_stack_fffffffffffff790 = (TreeDecomposition *)local_b0;
      std::__cxx11::string::pop_back();
      std::operator+((char *)in_stack_fffffffffffff7d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar8._M_p
                    );
      std::__cxx11::string::operator+=(local_28,local_570);
      std::__cxx11::string::~string(local_570);
    }
    std::__cxx11::string::operator+=(local_28,";\n\n");
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)local_b0);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x3115c5);
    local_b0._104_8_ = local_b0._104_8_ + 1;
  }
  std::operator+(&in_stack_fffffffffffff7b8->_name,(char *)in_stack_fffffffffffff7b0);
  std::ofstream::ofstream(local_770,local_790,_S_out);
  std::__cxx11::string::~string(local_790);
  std::operator<<(local_770,local_28);
  std::ofstream::close();
  std::ofstream::~ofstream(local_770);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SqlGenerator::generateLmfaoQuery()
{
    string returnString = "";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* v = _qc->getView(viewID);
        TDNode* node = _td->getRelation(v->_origin);

        size_t numberIncomingViews =
            (v->_origin == v->_destination ? node->_numOfNeighbors :
             node->_numOfNeighbors - 1);
        
        vector<bool> viewBitset(_qc->numberOfViews());

        string fvars = ""; 
        for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
            if (v->_fVars.test(i))
                fvars +=  _td->getAttribute(i)->_name + ",";
       
        string aggregateString = "";
        for (size_t aggNo = 0; aggNo < v->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = v->_aggregates[aggNo];

            string agg = "";
            size_t incomingCounter = 0;
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                string localAgg = "";
                const prod_bitset& product = aggregate->_agg[i];
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {  
                    if (product.test(f))
                        localAgg += getFunctionString(f)+"*";
                }

                agg += localAgg;
                
                string viewAgg = "";
                for (size_t n = 0; n < numberIncomingViews; ++n)
                {
                    std::pair<size_t,size_t> viewAggID =
                        aggregate->_incoming[incomingCounter];
                    
                    viewAgg += "agg_"+to_string(viewAggID.first)+"_"+
                        to_string(viewAggID.second)+"*";
                    viewBitset[viewAggID.first] = 1;
                    ++incomingCounter;
                }

                agg += viewAgg;

                if (!agg.empty())
                {
                    agg.pop_back();
                    agg += "+";
                }              
            }

            if (agg.empty())
                agg = "1";
            else
                agg.pop_back();

            aggregateString += "\nSUM("+agg+") AS agg_"+to_string(viewID)+
                "_"+to_string(aggNo)+",";
        }

        aggregateString.pop_back();

        
        returnString += "CREATE TABLE view_"+to_string(viewID)+" AS\nSELECT "+fvars+
            aggregateString+"\nFROM "+_td->getRelation(v->_origin)->_name+" ";
        for (size_t id = 0; id < _qc->numberOfViews(); ++id)
            if (viewBitset[id])
                returnString += "NATURAL JOIN view_"+to_string(id)+" ";

        if (!fvars.empty())
        {
            fvars.pop_back();
            returnString += "\nGROUP BY "+fvars;
        }
        
        returnString += ";\n\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao.sql", std::ofstream::out);
    ofs << returnString;
    ofs.close();
    // DINFO(returnString);   
}